

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.h
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionCosseratEasyRectangular::~ChBeamSectionCosseratEasyRectangular
          (ChBeamSectionCosseratEasyRectangular *this)

{
  ChBeamSectionCosserat::~ChBeamSectionCosserat(&this->super_ChBeamSectionCosserat);
  operator_delete(this,0x58);
  return;
}

Assistant:

class ChApi ChBeamSectionCosseratEasyRectangular : public ChBeamSectionCosserat {
  public:
    ChBeamSectionCosseratEasyRectangular(double width_y,  ///< width of section in y direction
                                         double width_z,  ///< width of section in z direction
                                         double E,        ///< Young modulus
                                         double G,        ///< shear modulus
                                         double density   ///< volumetric density (ex. in SI units: [kg/m^3])
    );
}